

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinimizeRecGroups.cpp
# Opt level: O0

void __thiscall wasm::anon_unknown_0::MinimizeRecGroups::run(MinimizeRecGroups *this,Module *module)

{
  allocator<wasm::HeapType> *this_00;
  Iterator __first;
  Iterator __last;
  type *__x;
  bool bVar1;
  size_t sVar2;
  size_type __n;
  reference pRVar3;
  reference types;
  type_conflict1 *ptVar4;
  size_type sVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x_00;
  reference pvVar6;
  reference pvVar7;
  reference pvVar8;
  reference pvVar9;
  pair<std::__detail::_Node_iterator<std::pair<const_wasm::HeapType,_unsigned_int>,_false,_true>,_bool>
  pVar10;
  ParentIndexIterator<const_wasm::RecGroup_*,_wasm::RecGroup::Iterator> PVar11;
  pair<std::__detail::_Node_iterator<std::pair<const_wasm::RecGroupShape,_unsigned_int>,_false,_true>,_bool>
  pVar12;
  uint local_404;
  undefined1 local_400 [4];
  Index i;
  TopologicalOrdersImpl<std::monostate> local_390;
  undefined1 local_320 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> permutation;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  deps;
  Iterator local_2e8;
  Iterator local_2d0;
  undefined1 local_2b8 [8];
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> sccTypes;
  SCC SStack_298;
  Index index;
  SCC scc;
  Iterator __end2_2;
  Iterator __begin2_2;
  TypeSCCs *__range2_2;
  type_conflict1 *inserted;
  type *_;
  RecGroupShape local_188;
  pair<const_wasm::RecGroupShape,_unsigned_int> local_180;
  pair<std::__detail::_Node_iterator<std::pair<const_wasm::RecGroupShape,_unsigned_int>,_false,_true>,_bool>
  local_170;
  ParentIndexIterator<const_wasm::RecGroup_*,_wasm::RecGroup::Iterator> local_160;
  ParentIndexIterator<const_wasm::RecGroup_*,_wasm::RecGroup::Iterator> local_150;
  RecGroup local_140;
  RecGroup group;
  iterator __end2_1;
  iterator __begin2_1;
  unordered_set<wasm::RecGroup,_std::hash<wasm::RecGroup>,_std::equal_to<wasm::RecGroup>,_std::allocator<wasm::RecGroup>_>
  *__range2_1;
  value_type local_110;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true> local_108;
  undefined1 local_100;
  size_type local_f8;
  pair<const_wasm::HeapType,_unsigned_int> local_f0;
  type *local_e0;
  type *info;
  type *type;
  _Self local_c8;
  iterator __end2;
  iterator __begin2;
  InsertOrderedMap<wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo> *__range2;
  unordered_set<wasm::RecGroup,_std::hash<wasm::RecGroup>,_std::equal_to<wasm::RecGroup>,_std::allocator<wasm::RecGroup>_>
  publicGroups;
  undefined1 local_68 [8];
  InsertOrderedMap<wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo> typeInfo;
  Module *module_local;
  MinimizeRecGroups *this_local;
  
  typeInfo.List.
  super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
  ._M_impl._M_node._M_size = (size_t)module;
  bVar1 = FeatureSet::hasGC(&module->features);
  if (bVar1) {
    initBrandOptions(this);
    wasm::ModuleUtils::collectHeapTypeInfo
              ((InsertOrderedMap<wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo> *)local_68,
               (Module *)
               typeInfo.List.
               super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
               ._M_impl._M_node._M_size,AllTypes,FindVisibility);
    sVar2 = InsertOrderedMap<wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>::size
                      ((InsertOrderedMap<wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo> *)local_68
                      );
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::reserve(&this->types,sVar2);
    std::
    unordered_set<wasm::RecGroup,_std::hash<wasm::RecGroup>,_std::equal_to<wasm::RecGroup>,_std::allocator<wasm::RecGroup>_>
    ::unordered_set((unordered_set<wasm::RecGroup,_std::hash<wasm::RecGroup>,_std::equal_to<wasm::RecGroup>,_std::allocator<wasm::RecGroup>_>
                     *)&__range2);
    __end2 = InsertOrderedMap<wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>::begin
                       ((InsertOrderedMap<wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo> *)
                        local_68);
    local_c8._M_node =
         (_List_node_base *)
         InsertOrderedMap<wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>::end
                   ((InsertOrderedMap<wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo> *)local_68);
    while (bVar1 = std::operator!=(&__end2,&local_c8), bVar1) {
      type = &std::_List_iterator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>
              ::operator*(&__end2)->first;
      info = (type *)std::get<0ul,wasm::HeapType_const,wasm::ModuleUtils::HeapTypeInfo>
                               ((pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo> *)type)
      ;
      local_e0 = std::get<1ul,wasm::HeapType_const,wasm::ModuleUtils::HeapTypeInfo>
                           ((pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo> *)type);
      if (local_e0->visibility == Private) {
        std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back
                  (&this->types,(value_type *)info);
        __x = info;
        local_f8 = std::
                   unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                   ::size(&this->typeIndices);
        std::pair<const_wasm::HeapType,_unsigned_int>::pair<unsigned_long,_true>
                  (&local_f0,(HeapType *)__x,&local_f8);
        pVar10 = std::
                 unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                 ::insert(&this->typeIndices,&local_f0);
        local_108._M_cur =
             (__node_type *)
             pVar10.first.
             super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>._M_cur;
        local_100 = pVar10.second;
      }
      else {
        local_110.id = (uintptr_t)HeapType::getRecGroup((HeapType *)info);
        std::
        unordered_set<wasm::RecGroup,_std::hash<wasm::RecGroup>,_std::equal_to<wasm::RecGroup>,_std::allocator<wasm::RecGroup>_>
        ::insert((unordered_set<wasm::RecGroup,_std::hash<wasm::RecGroup>,_std::equal_to<wasm::RecGroup>,_std::allocator<wasm::RecGroup>_>
                  *)&__range2,&local_110);
      }
      std::_List_iterator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>::
      operator++(&__end2);
    }
    __n = std::
          unordered_set<wasm::RecGroup,_std::hash<wasm::RecGroup>,_std::equal_to<wasm::RecGroup>,_std::allocator<wasm::RecGroup>_>
          ::size((unordered_set<wasm::RecGroup,_std::hash<wasm::RecGroup>,_std::equal_to<wasm::RecGroup>,_std::allocator<wasm::RecGroup>_>
                  *)&__range2);
    std::
    vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
    ::reserve(&this->publicGroupTypes,__n);
    __end2_1 = std::
               unordered_set<wasm::RecGroup,_std::hash<wasm::RecGroup>,_std::equal_to<wasm::RecGroup>,_std::allocator<wasm::RecGroup>_>
               ::begin((unordered_set<wasm::RecGroup,_std::hash<wasm::RecGroup>,_std::equal_to<wasm::RecGroup>,_std::allocator<wasm::RecGroup>_>
                        *)&__range2);
    group.id = (uintptr_t)
               std::
               unordered_set<wasm::RecGroup,_std::hash<wasm::RecGroup>,_std::equal_to<wasm::RecGroup>,_std::allocator<wasm::RecGroup>_>
               ::end((unordered_set<wasm::RecGroup,_std::hash<wasm::RecGroup>,_std::equal_to<wasm::RecGroup>,_std::allocator<wasm::RecGroup>_>
                      *)&__range2);
    while( true ) {
      bVar1 = std::__detail::operator!=
                        (&__end2_1.super__Node_iterator_base<wasm::RecGroup,_true>,
                         (_Node_iterator_base<wasm::RecGroup,_true> *)&group);
      if (!bVar1) break;
      pRVar3 = std::__detail::_Node_iterator<wasm::RecGroup,_true,_true>::operator*(&__end2_1);
      local_140.id = pRVar3->id;
      PVar11 = (ParentIndexIterator<const_wasm::RecGroup_*,_wasm::RecGroup::Iterator>)
               RecGroup::begin(&local_140);
      local_150 = PVar11;
      PVar11 = (ParentIndexIterator<const_wasm::RecGroup_*,_wasm::RecGroup::Iterator>)
               RecGroup::end(&local_140);
      local_160 = PVar11;
      std::
      vector<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,std::allocator<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>
      ::emplace_back<wasm::RecGroup::Iterator,wasm::RecGroup::Iterator>
                ((vector<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,std::allocator<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>
                  *)&this->publicGroupTypes,(Iterator *)&local_150,(Iterator *)&local_160);
      types = std::
              vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
              ::back(&this->publicGroupTypes);
      RecGroupShape::RecGroupShape(&local_188,types);
      std::pair<const_wasm::RecGroupShape,_unsigned_int>::pair<wasm::RecGroupShape,_true>
                (&local_180,&local_188,&PublicGroupIndex);
      pVar12 = std::
               unordered_map<wasm::RecGroupShape,_unsigned_int,_std::hash<wasm::RecGroupShape>,_std::equal_to<wasm::RecGroupShape>,_std::allocator<std::pair<const_wasm::RecGroupShape,_unsigned_int>_>_>
               ::insert(&this->groupShapeIndices,&local_180);
      local_170.first =
           pVar12.first.
           super__Node_iterator_base<std::pair<const_wasm::RecGroupShape,_unsigned_int>,_true>.
           _M_cur;
      local_170.second = pVar12.second;
      std::
      get<0ul,std::__detail::_Node_iterator<std::pair<wasm::RecGroupShape_const,unsigned_int>,false,true>,bool>
                (&local_170);
      ptVar4 = std::
               get<1ul,std::__detail::_Node_iterator<std::pair<wasm::RecGroupShape_const,unsigned_int>,false,true>,bool>
                         (&local_170);
      if ((*ptVar4 & 1U) == 0) {
        __assert_fail("inserted",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MinimizeRecGroups.cpp"
                      ,0x196,
                      "virtual void wasm::(anonymous namespace)::MinimizeRecGroups::run(Module *)");
      }
      std::__detail::_Node_iterator<wasm::RecGroup,_true,_true>::operator++(&__end2_1);
    }
    sVar5 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::size(&this->types);
    std::
    vector<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
    ::reserve(&this->groups,sVar5);
    TypeSCCs::TypeSCCs((TypeSCCs *)&__begin2_2,&this->types);
    __end2_2 = SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
               ::begin((SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
                        *)&__begin2_2);
    scc.parent = (SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
                  *)SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
                    ::end((SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
                           *)&__begin2_2);
    while( true ) {
      bVar1 = SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
              ::Iterator::operator!=(&__end2_2,(Iterator *)&scc);
      if (!bVar1) break;
      SStack_298 = SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
                   ::Iterator::operator*(&__end2_2);
      sVar2 = DisjointSets::addSet(&this->equivalenceClasses);
      sccTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = (undefined4)sVar2;
      sVar5 = std::
              vector<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
              ::size(&this->groups);
      if ((sVar2 & 0xffffffff) != sVar5) {
        __assert_fail("index == groups.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MinimizeRecGroups.cpp"
                      ,0x1a1,
                      "virtual void wasm::(anonymous namespace)::MinimizeRecGroups::run(Module *)");
      }
      std::
      vector<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
      ::emplace_back<>(&this->groups);
      SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
      ::SCC::begin(&local_2d0,&stack0xfffffffffffffd68);
      SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
      ::SCC::end(&local_2e8,&stack0xfffffffffffffd68);
      this_00 = (allocator<wasm::HeapType> *)
                ((long)&deps.
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
      std::allocator<wasm::HeapType>::allocator(this_00);
      __first.val.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload =
           local_2d0.val.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::HeapType>._M_payload;
      __first.parent = local_2d0.parent;
      __first.val.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_engaged =
           local_2d0.val.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::HeapType>._M_engaged;
      __first.val.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._9_7_ =
           local_2d0.val.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::HeapType>._9_7_;
      __last.val.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload =
           local_2e8.val.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::HeapType>._M_payload;
      __last.parent = local_2e8.parent;
      __last.val.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_engaged =
           local_2e8.val.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::HeapType>._M_engaged;
      __last.val.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._9_7_ =
           local_2e8.val.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::HeapType>._9_7_;
      std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
      vector<wasm::SCCs<__gnu_cxx::__normal_iterator<wasm::HeapType_const*,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>,wasm::(anonymous_namespace)::TypeSCCs>::SCC::Iterator,void>
                ((vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)local_2b8,__first,__last,
                 this_00);
      std::allocator<wasm::HeapType>::~allocator
                ((allocator<wasm::HeapType> *)
                 ((long)&deps.
                         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      createSubtypeGraph((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          *)&permutation.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage,
                         (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_2b8);
      TopologicalOrdersImpl<std::monostate>::TopologicalOrdersImpl
                ((TopologicalOrdersImpl<std::monostate> *)local_400,
                 (Graph *)&permutation.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
      TopologicalOrdersImpl<std::monostate>::begin
                (&local_390,(TopologicalOrdersImpl<std::monostate> *)local_400);
      __x_00 = TopologicalOrdersImpl<std::monostate>::operator*(&local_390);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_320,__x_00);
      TopologicalOrdersImpl<std::monostate>::~TopologicalOrdersImpl(&local_390);
      TopologicalOrdersImpl<std::monostate>::~TopologicalOrdersImpl
                ((TopologicalOrdersImpl<std::monostate> *)local_400);
      pvVar6 = std::
               vector<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
               ::back(&this->groups);
      sVar5 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::size
                        ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_2b8);
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::resize(&pvVar6->group,sVar5);
      local_404 = 0;
      while( true ) {
        sVar5 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::size
                          ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_2b8);
        if (sVar5 <= local_404) break;
        pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_320,
                            (ulong)local_404);
        pvVar8 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                           ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_2b8,
                            (ulong)*pvVar7);
        pvVar6 = std::
                 vector<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
                 ::back(&this->groups);
        pvVar9 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                           (&pvVar6->group,(ulong)local_404);
        pvVar9->id = pvVar8->id;
        local_404 = local_404 + 1;
      }
      bVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty(&this->shapesToUpdate)
      ;
      if (!bVar1) {
        __assert_fail("shapesToUpdate.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MinimizeRecGroups.cpp"
                      ,0x1ad,
                      "virtual void wasm::(anonymous namespace)::MinimizeRecGroups::run(Module *)");
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&this->shapesToUpdate,
                 (value_type_conflict2 *)
                 ((long)&sccTypes.
                         super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
                         .super__Vector_impl_data._M_end_of_storage + 4));
      updateShapes(this);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_320);
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *)&permutation.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_2b8);
      SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
      ::Iterator::operator++(&__end2_2);
    }
    TypeSCCs::~TypeSCCs((TypeSCCs *)&__begin2_2);
    rewriteTypes(this,(Module *)
                      typeInfo.List.
                      super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
                      ._M_impl._M_node._M_size);
    std::
    unordered_set<wasm::RecGroup,_std::hash<wasm::RecGroup>,_std::equal_to<wasm::RecGroup>,_std::allocator<wasm::RecGroup>_>
    ::~unordered_set((unordered_set<wasm::RecGroup,_std::hash<wasm::RecGroup>,_std::equal_to<wasm::RecGroup>,_std::allocator<wasm::RecGroup>_>
                      *)&__range2);
    InsertOrderedMap<wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>::~InsertOrderedMap
              ((InsertOrderedMap<wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo> *)local_68);
  }
  return;
}

Assistant:

void run(Module* module) override {
    // There are no recursion groups to minimize if GC is not enabled.
    if (!module->features.hasGC()) {
      return;
    }

    initBrandOptions();

    auto typeInfo = ModuleUtils::collectHeapTypeInfo(
      *module,
      ModuleUtils::TypeInclusion::AllTypes,
      ModuleUtils::VisibilityHandling::FindVisibility);

    types.reserve(typeInfo.size());

    // We cannot optimize public types, but we do need to make sure we don't
    // generate new groups with the same shape.
    std::unordered_set<RecGroup> publicGroups;
    for (auto& [type, info] : typeInfo) {
      if (info.visibility == ModuleUtils::Visibility::Private) {
        // We can optimize private types.
        types.push_back(type);
        typeIndices.insert({type, typeIndices.size()});
      } else {
        publicGroups.insert(type.getRecGroup());
      }
    }

    publicGroupTypes.reserve(publicGroups.size());
    for (auto group : publicGroups) {
      publicGroupTypes.emplace_back(group.begin(), group.end());
      [[maybe_unused]] auto [_, inserted] = groupShapeIndices.insert(
        {RecGroupShape(publicGroupTypes.back()), PublicGroupIndex});
      assert(inserted);
    }

    // The number of types to optimize is an upper bound on the number of
    // recursion groups we will emit.
    groups.reserve(types.size());

    // Compute the strongly connected components and ensure they form distinct
    // recursion groups.
    for (auto scc : TypeSCCs(types)) {
      [[maybe_unused]] Index index = equivalenceClasses.addSet();
      assert(index == groups.size());
      groups.emplace_back();

      // The SCC is not necessarily topologically sorted to have the supertypes
      // come first. Fix that.
      std::vector<HeapType> sccTypes(scc.begin(), scc.end());
      auto deps = createSubtypeGraph(sccTypes);
      auto permutation = *TopologicalOrders(deps).begin();
      groups.back().group.resize(sccTypes.size());
      for (Index i = 0; i < sccTypes.size(); ++i) {
        groups.back().group[i] = sccTypes[permutation[i]];
      }
      assert(shapesToUpdate.empty());
      shapesToUpdate.push_back(index);
      updateShapes();
    }

    rewriteTypes(*module);
  }